

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_func_call_arg_abi_cxx11_
          (CompilerGLSL *this,Parameter *param_1,uint32_t id)

{
  uint32_t uVar1;
  SPIRVariable *pSVar2;
  uint32_t in_ECX;
  SPIRVariable *var;
  uint32_t name_id;
  uint32_t id_local;
  Parameter *param_1_local;
  CompilerGLSL *this_local;
  
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)param_1,in_ECX);
  var._0_4_ = in_ECX;
  if (pSVar2 != (SPIRVariable *)0x0) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->basevariable);
    if (uVar1 != 0) {
      var._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->basevariable);
    }
  }
  to_expression_abi_cxx11_(this,(uint32_t)param_1,SUB41((uint32_t)var,0));
  return this;
}

Assistant:

string CompilerGLSL::to_func_call_arg(const SPIRFunction::Parameter &, uint32_t id)
{
	// Make sure that we use the name of the original variable, and not the parameter alias.
	uint32_t name_id = id;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
		name_id = var->basevariable;
	return to_expression(name_id);
}